

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O2

void PushIdentityTable(int slot)

{
  FRemapTable *this;
  FRemapTablePtr local_20;
  
  this = (FRemapTable *)operator_new(0x20);
  FRemapTable::FRemapTable(this,0x100);
  FRemapTable::MakeIdentity(this);
  local_20.Ptr = this;
  TArray<FRemapTablePtr,_FRemapTable_*>::Push
            (&translationtables[(uint)slot].super_TArray<FRemapTablePtr,_FRemapTable_*>,&local_20);
  return;
}

Assistant:

static void PushIdentityTable(int slot)
{
	FRemapTable *table = new FRemapTable;
	table->MakeIdentity();
	translationtables[slot].Push(table);
}